

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_TEXLD(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x02','\0');
  if (iVar1 == 0) {
    iVar1 = shader_version_atleast(ctx,'\x01','\x04');
    if (iVar1 == 0) {
      emit_D3D_opcode_d(ctx,"tex");
    }
    else {
      emit_D3D_opcode_ds(ctx,"texld");
    }
  }
  else if (ctx->instruction_controls == 0) {
    emit_D3D_opcode_dss(ctx,"texld");
  }
  else if (ctx->instruction_controls == 1) {
    emit_D3D_opcode_dss(ctx,"texldp");
  }
  else if (ctx->instruction_controls == 2) {
    emit_D3D_opcode_dss(ctx,"texldb");
  }
  return;
}

Assistant:

static void emit_D3D_TEXLD(Context *ctx)
{
    // this opcode looks and acts differently depending on the shader model.
    if (shader_version_atleast(ctx, 2, 0))
    {
        if (ctx->instruction_controls == CONTROL_TEXLD)
           emit_D3D_opcode_dss(ctx, "texld");
        else if (ctx->instruction_controls == CONTROL_TEXLDP)
           emit_D3D_opcode_dss(ctx, "texldp");
        else if (ctx->instruction_controls == CONTROL_TEXLDB)
           emit_D3D_opcode_dss(ctx, "texldb");
    } // if

    else if (shader_version_atleast(ctx, 1, 4))
    {
        emit_D3D_opcode_ds(ctx, "texld");
    } // else if

    else
    {
        emit_D3D_opcode_d(ctx, "tex");
    } // else
}